

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseModuleFieldList(WastParser *this,Module *module)

{
  ModuleFieldType MVar1;
  pointer pTVar2;
  pointer pTVar3;
  bool bVar4;
  bool bVar5;
  TokenType TVar6;
  TokenType TVar7;
  Result RVar8;
  _Hash_node_base *p_Var9;
  Func *func;
  Errors *errors;
  TokenTypePair pair;
  TokenTypePair pair_00;
  _func_int **pp_Var10;
  FuncDeclaration *decl;
  ModuleField *field;
  ModuleField *pMVar11;
  ResolveFuncTypesExprVisitorDelegate delegate;
  Delegate local_98;
  Module *local_90;
  Errors *local_88;
  ExprVisitor local_80;
  
  TVar6 = Peek(this,0);
  TVar7 = Peek(this,1);
  pair._M_elems[1] = TVar7;
  pair._M_elems[0] = TVar6;
  bVar4 = anon_unknown_1::IsModuleField(pair);
  if (bVar4) {
    do {
      RVar8 = ParseModuleField(this,module);
      if ((RVar8.enum_ == Error) &&
         (RVar8 = Synchronize(this,anon_unknown_1::IsModuleField), RVar8.enum_ == Error)) {
        return (Result)Error;
      }
      TVar6 = Peek(this,0);
      TVar7 = Peek(this,1);
      pair_00._M_elems[1] = TVar7;
      pair_00._M_elems[0] = TVar6;
      bVar4 = anon_unknown_1::IsModuleField(pair_00);
    } while (bVar4);
  }
  errors = this->errors_;
  pMVar11 = (module->fields).first_;
  if (pMVar11 != (ModuleField *)0x0) {
    bVar4 = false;
    do {
      MVar1 = pMVar11->type_;
      if (MVar1 == Event) {
        decl = (FuncDeclaration *)&pMVar11[1].loc.filename.size_;
LAB_0018459f:
        func = (Func *)0x0;
LAB_001845a1:
        bVar5 = anon_unknown_1::ResolveFuncTypeWithEmptySignature(module,decl);
        anon_unknown_1::ResolveImplicitlyDefinedFunctionType(&pMVar11->loc,module,decl);
        RVar8 = anon_unknown_1::CheckFuncTypeVarMatchesExplicit(&pMVar11->loc,module,decl,errors);
        bVar4 = RVar8.enum_ == Error || bVar4;
        if (func != (Func *)0x0) {
          if ((bVar5) &&
             (p_Var9 = (func->bindings).
                       super_unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_>_>
                       ._M_h._M_before_begin._M_nxt, p_Var9 != (_Hash_node_base *)0x0)) {
            pTVar2 = (func->decl).sig.param_types.
                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            pTVar3 = (func->decl).sig.param_types.
                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                     super__Vector_impl_data._M_start;
            do {
              *(int *)&p_Var9[9]._M_nxt =
                   *(int *)&p_Var9[9]._M_nxt + (int)((ulong)((long)pTVar2 - (long)pTVar3) >> 2);
              p_Var9 = p_Var9->_M_nxt;
            } while (p_Var9 != (_Hash_node_base *)0x0);
          }
          local_98._vptr_Delegate = (_func_int **)&PTR__Delegate_00207c00;
          local_90 = module;
          local_88 = errors;
          ExprVisitor::ExprVisitor(&local_80,&local_98);
          RVar8 = ExprVisitor::VisitFunc(&local_80,func);
          if (local_80.expr_iter_stack_.
              super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_80.expr_iter_stack_.
                            super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_80.expr_stack_.super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_80.expr_stack_.
                            super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_80.state_stack_.
              super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_80.state_stack_.
                            super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          bVar4 = bVar4 || RVar8.enum_ == Error;
        }
      }
      else {
        if (MVar1 == Import) {
          pp_Var10 = pMVar11[1]._vptr_ModuleField;
          if (pp_Var10 == (_func_int **)0x0 || *(int *)(pp_Var10 + 9) != 0) {
            if (*(int *)(pp_Var10 + 9) != 4) {
              pp_Var10 = (_func_int **)0x0;
            }
            if (pp_Var10 == (_func_int **)0x0) goto LAB_0018468f;
          }
          decl = (FuncDeclaration *)(pp_Var10 + 0xe);
          goto LAB_0018459f;
        }
        if (MVar1 == Func) {
          func = (Func *)(pMVar11 + 1);
          decl = (FuncDeclaration *)&pMVar11[1].loc.filename.size_;
          goto LAB_001845a1;
        }
      }
LAB_0018468f:
      pMVar11 = (pMVar11->super_intrusive_list_base<wabt::ModuleField>).next_;
    } while (pMVar11 != (ModuleField *)0x0);
    if (bVar4) {
      return (Result)Error;
    }
    errors = this->errors_;
  }
  RVar8 = ResolveNamesModule(module,errors);
  return (Result)(uint)(RVar8.enum_ == Error);
}

Assistant:

Result WastParser::ParseModuleFieldList(Module* module) {
  WABT_TRACE(ParseModuleFieldList);
  while (IsModuleField(PeekPair())) {
    if (Failed(ParseModuleField(module))) {
      CHECK_RESULT(Synchronize(IsModuleField));
    }
  }
  CHECK_RESULT(ResolveFuncTypes(module, errors_));
  CHECK_RESULT(ResolveNamesModule(module, errors_));
  return Result::Ok;
}